

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

void __thiscall MODEL3D::three_dim_model::initialize_layer_boundary_map(three_dim_model *this)

{
  _Base_ptr p_Var1;
  _Self __tmp;
  initializer_list<int> __l;
  allocator_type local_71;
  vector<int,_std::allocator<int>_> spots;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_58;
  
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&(this->layer_boundary_map)._M_t);
  local_58.first = 0;
  local_58._4_4_ = 0;
  local_58.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __l._M_len = 4;
  __l._M_array = &local_58.first;
  std::vector<int,_std::allocator<int>_>::vector(&spots,__l,&local_71);
  for (p_Var1 = (this->polygons_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->polygons_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::
    pair<const_unsigned_int_&,_std::vector<int,_std::allocator<int>_>_&,_true>
              (&local_58,&p_Var1[1]._M_color,&spots);
    std::
    _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
    ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
              ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                *)&this->layer_boundary_map,&local_58);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_58.second.super__Vector_base<int,_std::allocator<int>_>);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&spots.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void MODEL3D::three_dim_model::initialize_layer_boundary_map()
{
    layer_boundary_map.clear();
    auto i_end = polygons_map.end();
    std::vector<int> spots = {0,0,0,0};
    for (auto i = polygons_map.begin(); i != i_end; i++)
    {
        layer_boundary_map.insert({i->first, spots});
    }
}